

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void regenerateSHBuffer(void)

{
  pointer pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  pointer pfVar8;
  size_t sVar9;
  undefined8 in_RAX;
  value_type *pvVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  std::vector<float,_std::allocator<float>_>::resize(&legendre_scalars,vertex_count * 9);
  sVar9 = vertex_count;
  pfVar8 = legendre_scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar7 = legendre_2_zz_scalar;
  fVar6 = legendre_2_scalar;
  fVar5 = legendre_1_scalar;
  fVar13 = -legendre_1_scalar;
  fVar12 = -legendre_2_scalar;
  fVar14 = legendre_2_scalar * 0.5;
  pvVar10 = &((sphere_positions.
               super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0).field_0.z;
  for (uVar11 = 0; uVar11 < sVar9; uVar11 = uVar11 + 1) {
    fVar2 = ((anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float>_1_0 *)
            (pvVar10 + -2))->x;
    fVar3 = pvVar10[-1];
    fVar4 = *pvVar10;
    pfVar1 = pfVar8 + uVar11;
    *pfVar1 = 0.15915494;
    pfVar1[sVar9] = fVar3 * fVar13;
    pfVar1[sVar9 * 2] = fVar4 * fVar5;
    pfVar1[sVar9 * 3] = fVar2 * fVar13;
    pfVar1[sVar9 * 4] = fVar3 * fVar6 * fVar2;
    pfVar1[sVar9 * 5] = fVar3 * fVar12 * fVar4;
    pfVar1[sVar9 * 6] = (fVar4 * 3.0 * fVar4 + -1.0) * fVar7;
    pfVar1[sVar9 * 7] = fVar4 * fVar12 * fVar2;
    pfVar1[sVar9 * 8] = (fVar2 * fVar2 - fVar3 * fVar3) * fVar14;
    pvVar10 = pvVar10 + 3;
  }
  (*__glewBindBuffer)(0x8892,legendre_buffer);
  (*__glewBufferData)(0x8892,vertex_count * 0x24,
                      legendre_scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,0x88e4,in_RAX);
  return;
}

Assistant:

void regenerateSHBuffer() {
    Perf stat("Regenerate SH Buffer");
    legendre_scalars.resize(9 * vertex_count);
    for (int n = 0; n < vertex_count; n++) {
        vec3 pos = sphere_positions[n];
        legendre_scalars[n + 0*vertex_count] = legendre_0_0(pos);
        legendre_scalars[n + 1*vertex_count] = legendre_1_0(pos);
        legendre_scalars[n + 2*vertex_count] = legendre_1_1(pos);
        legendre_scalars[n + 3*vertex_count] = legendre_1_2(pos);
        legendre_scalars[n + 4*vertex_count] = legendre_2_0(pos);
        legendre_scalars[n + 5*vertex_count] = legendre_2_1(pos);
        legendre_scalars[n + 6*vertex_count] = legendre_2_2(pos);
        legendre_scalars[n + 7*vertex_count] = legendre_2_3(pos);
        legendre_scalars[n + 8*vertex_count] = legendre_2_4(pos);
    }

    glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
    glBufferData(GL_ARRAY_BUFFER, vertex_count * sizeof(float) * 9, legendre_scalars.data(), GL_STATIC_DRAW);
}